

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegAudioStreamReader.cpp
# Opt level: O0

int __thiscall
MpegAudioStreamReader::getTSDescriptor
          (MpegAudioStreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  int local_38 [2];
  int skipBeforeBytes;
  int skipBytes;
  uint8_t *frame;
  bool hdmvDescriptors_local;
  uint8_t *puStack_20;
  bool blurayMode_local;
  uint8_t *dstBuff_local;
  MpegAudioStreamReader *this_local;
  
  frame._6_1_ = hdmvDescriptors;
  frame._7_1_ = blurayMode;
  puStack_20 = dstBuff;
  dstBuff_local = (uint8_t *)this;
  _skipBeforeBytes =
       findFrame(this,(this->super_SimplePacketizerReader).super_AbstractStreamReader.m_buffer,
                 (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd);
  if (_skipBeforeBytes != (uint8_t *)0x0) {
    local_38[1] = 0;
    local_38[0] = 0;
    decodeFrame(this,_skipBeforeBytes,
                (this->super_SimplePacketizerReader).super_AbstractStreamReader.m_bufEnd,
                local_38 + 1,local_38);
  }
  return 0;
}

Assistant:

int MpegAudioStreamReader::getTSDescriptor(uint8_t* dstBuff, bool blurayMode, bool hdmvDescriptors)
{
    uint8_t* frame = findFrame(m_buffer, m_bufEnd);
    if (frame == nullptr)
        return 0;
    int skipBytes = 0;
    int skipBeforeBytes = 0;
    decodeFrame(frame, m_bufEnd, skipBytes, skipBeforeBytes);
    return 0;
}